

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

CopyStatus kwssys::SystemTools::CloneFileContent(string *source,string *destination)

{
  CopyStatus CVar1;
  int iVar2;
  char *pcVar3;
  Status s;
  int out;
  int in;
  CopyStatus status;
  string *in_stack_ffffffffffffff88;
  CopyStatus local_54;
  Status local_48;
  Status local_40;
  int local_38;
  Status local_34;
  Status local_2c;
  uint local_24;
  CopyStatus local_c;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_24 = open(pcVar3,0);
  if ((int)local_24 < 0) {
    local_2c = Status::POSIX_errno();
    CopyStatus::CopyStatus(&local_c,local_2c,SourcePath);
  }
  else {
    local_34 = RemoveFile(in_stack_ffffffffffffff88);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_38 = open(pcVar3,0x241,0x180);
    if (local_38 < 0) {
      local_40 = Status::POSIX_errno();
      CopyStatus::CopyStatus(&local_c,local_40,DestPath);
      close(local_24);
    }
    else {
      local_48 = Status::Success();
      CopyStatus::CopyStatus(&local_c,local_48,NoPath);
      iVar2 = ioctl(local_38,0x40049409,(ulong)local_24);
      if (iVar2 < 0) {
        s = Status::POSIX_errno();
        CopyStatus::CopyStatus(&local_54,s,NoPath);
        local_c.super_Status = local_54.super_Status;
        local_c.Path = local_54.Path;
      }
      close(local_24);
      close(local_38);
    }
  }
  CVar1.Path = local_c.Path;
  CVar1.super_Status = local_c.super_Status;
  return CVar1;
}

Assistant:

SystemTools::CopyStatus SystemTools::CloneFileContent(
  std::string const& source, std::string const& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    CopyStatus status{ Status::POSIX_errno(), CopyStatus::DestPath };
    close(in);
    return status;
  }

  CopyStatus status{ Status::Success(), CopyStatus::NoPath };
  if (ioctl(out, FICLONE, in) < 0) {
    status = CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
  close(in);
  close(out);

  return status;
#elif defined(__APPLE__) &&                                                   \
  defined(KWSYS_SYSTEMTOOLS_HAVE_MACOS_COPYFILE_CLONE)
  // When running as root, copyfile() copies more metadata than we
  // want, such as ownership.  Pretend it is not available.
  if (getuid() == 0) {
    return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
  }

  // NOTE: we cannot use `clonefile` as the {a,c,m}time for the file needs to
  // be updated by `copy_file_if_different` and `copy_file`.
  if (copyfile(source.c_str(), destination.c_str(), nullptr,
               COPYFILE_METADATA | COPYFILE_CLONE) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
#  if KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, destination.c_str(), nullptr, 0) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  else
  // fall back to utimes
  if (utimes(destination.c_str(), nullptr) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  endif
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
#else
  (void)source;
  (void)destination;
  return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
#endif
}